

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmPropertyDefinition * __thiscall
cmState::GetPropertyDefinition(cmState *this,string *name,ScopeType scope)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>
  local_40;
  _Rb_tree_const_iterator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_> local_38
  ;
  cmPropertyDefinitionMap *local_30;
  cmPropertyDefinitionMap *defs;
  string *psStack_20;
  ScopeType scope_local;
  string *name_local;
  cmState *this_local;
  
  defs._4_4_ = scope;
  psStack_20 = name;
  name_local = (string *)this;
  bVar1 = IsPropertyDefined(this,name,scope);
  if (bVar1) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
         ::find(&this->PropertyDefinitions,(key_type *)((long)&defs + 4));
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>
             ::operator->(&local_38);
    local_30 = &ppVar2->second;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
         ::find(&local_30->
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
                ,psStack_20);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>
             ::operator->(&local_40);
    this_local = (cmState *)&ppVar3->second;
  }
  else {
    this_local = (cmState *)0x0;
  }
  return (cmPropertyDefinition *)this_local;
}

Assistant:

cmPropertyDefinition const* cmState
::GetPropertyDefinition(const std::string& name,
                        cmProperty::ScopeType scope) const
{
  if (this->IsPropertyDefined(name,scope))
    {
    cmPropertyDefinitionMap const& defs =
        this->PropertyDefinitions.find(scope)->second;
    return &defs.find(name)->second;
    }
  return 0;
}